

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_open_connected(void)

{
  int iVar1;
  uv_os_sock_t __fd;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_tcp_t client;
  
  buf = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    __fd = create_tcp_socket();
    iVar1 = connect(__fd,(sockaddr *)&addr,0x10);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&client);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_open(&client,__fd);
        if (iVar1 == 0) {
          iVar1 = uv_write(&write_req,(uv_stream_t *)&client,&buf,1,write_cb);
          if (iVar1 == 0) {
            iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)&client,shutdown_cb);
            if (iVar1 == 0) {
              iVar1 = uv_read_start((uv_stream_t *)&client,alloc_cb,read_cb);
              if (iVar1 == 0) {
                puVar2 = uv_default_loop();
                uv_run(puVar2,UV_RUN_DEFAULT);
                if (shutdown_cb_called == 1) {
                  if (write_cb_called == 1) {
                    if (close_cb_called == 1) {
                      puVar2 = uv_default_loop();
                      close_loop(puVar2);
                      puVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(puVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                      uVar3 = 0x16b;
                    }
                    else {
                      pcVar4 = "close_cb_called == 1";
                      uVar3 = 0x169;
                    }
                  }
                  else {
                    pcVar4 = "write_cb_called == 1";
                    uVar3 = 0x168;
                  }
                }
                else {
                  pcVar4 = "shutdown_cb_called == 1";
                  uVar3 = 0x167;
                }
              }
              else {
                pcVar4 = "0 == uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb)";
                uVar3 = 0x163;
              }
            }
            else {
              pcVar4 = "0 == uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb)";
              uVar3 = 0x161;
            }
          }
          else {
            pcVar4 = "0 == uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb)";
            uVar3 = 0x15f;
          }
        }
        else {
          pcVar4 = "0 == uv_tcp_open(&client, sock)";
          uVar3 = 0x15d;
        }
      }
      else {
        pcVar4 = "0 == uv_tcp_init(uv_default_loop(), &client)";
        uVar3 = 0x15b;
      }
    }
    else {
      pcVar4 = "0 == connect(sock, (struct sockaddr*) &addr, sizeof(addr))";
      uVar3 = 0x159;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar3 = 0x154;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_open_connected) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_sock_t sock;
  uv_buf_t buf = uv_buf_init("PING", 4);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == connect(sock, (struct sockaddr*) &addr,  sizeof(addr)));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));

  ASSERT(0 == uv_tcp_open(&client, sock));

  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &client, &buf, 1, write_cb));

  ASSERT(0 == uv_shutdown(&shutdown_req, (uv_stream_t*) &client, shutdown_cb));

  ASSERT(0 == uv_read_start((uv_stream_t*) &client, alloc_cb, read_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(shutdown_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}